

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_request.c
# Opt level: O0

void ngx_http_process_request_headers(ngx_event_t *rev)

{
  undefined8 *puVar1;
  ngx_http_request_t *r_00;
  void *pvVar2;
  ngx_int_t nVar3;
  ssize_t sVar4;
  ngx_uint_t *pnVar5;
  void *pvVar6;
  long lVar7;
  ngx_http_core_main_conf_t *cmcf;
  ngx_http_core_srv_conf_t *cscf;
  ngx_http_request_t *r;
  ngx_http_header_t *hh;
  ngx_connection_t *c;
  ngx_table_elt_t *h;
  ngx_int_t rv;
  ngx_int_t rc;
  ssize_t n;
  size_t len;
  u_char *p;
  ngx_event_t *rev_local;
  
  puVar1 = (undefined8 *)rev->data;
  r_00 = (ngx_http_request_t *)*puVar1;
  if ((rev->log->log_level & 0x100) != 0) {
    ngx_log_error_core(8,rev->log,0,"http process request header line");
  }
  if ((*(uint *)&rev->field_0x8 >> 10 & 1) == 0) {
    pvVar2 = r_00->main_conf[ngx_http_core_module.ctx_index];
    rv = -2;
    do {
      while( true ) {
        if (rv == -2) {
          if (r_00->header_in->pos == r_00->header_in->end) {
            nVar3 = ngx_http_alloc_large_header_buffer(r_00,0);
            if (nVar3 == -1) {
              ngx_http_close_request(r_00,500);
              return;
            }
            if (nVar3 == -5) {
              *(ulong *)&r_00->field_0x468 =
                   *(ulong *)&r_00->field_0x468 & 0xfffffffffffff7ff | 0x800;
              if (r_00->header_name_start == (u_char *)0x0) {
                if (6 < *(ulong *)puVar1[10]) {
                  ngx_log_error_core(7,(ngx_log_t *)puVar1[10],0,"client sent too large request");
                }
                ngx_http_finalize_request(r_00,0x1ee);
                return;
              }
              n = (long)r_00->header_in->end - (long)r_00->header_name_start;
              if (0x6d4 < (ulong)n) {
                n = 0x6d4;
              }
              if (6 < *(ulong *)puVar1[10]) {
                ngx_log_error_core(7,(ngx_log_t *)puVar1[10],0,
                                   "client sent too long header line: \"%*s...\"",n,
                                   r_00->header_name_start);
              }
              ngx_http_finalize_request(r_00,0x1ee);
              return;
            }
          }
          sVar4 = ngx_http_read_request_header(r_00);
          if (sVar4 == -2) {
            return;
          }
          if (sVar4 == -1) {
            return;
          }
        }
        pvVar6 = r_00->srv_conf[ngx_http_core_module.ctx_index];
        rv = ngx_http_parse_header_line(r_00,r_00->header_in,*(ngx_uint_t *)((long)pvVar6 + 0x80));
        if (rv != 0) break;
        r_00->request_length =
             (off_t)(r_00->header_in->pos + (r_00->request_length - (long)r_00->header_name_start));
        if (((*(ulong *)&r_00->field_0x460 >> 0x29 & 1) == 0) ||
           (*(long *)((long)pvVar6 + 0x70) == 0)) {
          pnVar5 = (ngx_uint_t *)ngx_list_push(&(r_00->headers_in).headers);
          if (pnVar5 == (ngx_uint_t *)0x0) {
            ngx_http_close_request(r_00,500);
            return;
          }
          *pnVar5 = r_00->header_hash;
          pnVar5[1] = (long)r_00->header_name_end - (long)r_00->header_name_start;
          pnVar5[2] = (ngx_uint_t)r_00->header_name_start;
          *(undefined1 *)(pnVar5[2] + pnVar5[1]) = 0;
          pnVar5[3] = (long)r_00->header_end - (long)r_00->header_start;
          pnVar5[4] = (ngx_uint_t)r_00->header_start;
          *(undefined1 *)(pnVar5[4] + pnVar5[3]) = 0;
          pvVar6 = ngx_pnalloc(r_00->pool,pnVar5[1]);
          pnVar5[5] = (ngx_uint_t)pvVar6;
          if (pnVar5[5] == 0) {
            ngx_http_close_request(r_00,500);
            return;
          }
          if (pnVar5[1] == r_00->lowcase_index) {
            memcpy((void *)pnVar5[5],r_00->lowcase_header,pnVar5[1]);
          }
          else {
            ngx_strlow((u_char *)pnVar5[5],(u_char *)pnVar5[2],pnVar5[1]);
          }
          pvVar6 = ngx_hash_find((ngx_hash_t *)((long)pvVar2 + 0x40),*pnVar5,(u_char *)pnVar5[5],
                                 pnVar5[1]);
          if ((pvVar6 != (void *)0x0) &&
             (lVar7 = (**(code **)((long)pvVar6 + 0x18))
                                (r_00,pnVar5,*(undefined8 *)((long)pvVar6 + 0x10)), lVar7 != 0)) {
            return;
          }
          if ((r_00->connection->log->log_level & 0x100) != 0) {
            ngx_log_error_core(8,r_00->connection->log,0,"http header: \"%V: %V\"",pnVar5 + 1,
                               pnVar5 + 3);
          }
        }
        else if (6 < *(ulong *)puVar1[10]) {
          ngx_log_error_core(7,(ngx_log_t *)puVar1[10],0,"client sent invalid header line: \"%*s\"",
                             (long)r_00->header_end - (long)r_00->header_name_start,
                             r_00->header_name_start);
        }
      }
      if (rv == 1) {
        if ((r_00->connection->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,r_00->connection->log,0,"http header done");
        }
        r_00->request_length =
             (off_t)(r_00->header_in->pos + (r_00->request_length - (long)r_00->header_name_start));
        *(ulong *)&r_00->field_0x460 =
             *(ulong *)&r_00->field_0x460 & 0xffffffe1ffffffff | 0x400000000;
        nVar3 = ngx_http_process_request_header(r_00);
        if (nVar3 != 0) {
          return;
        }
        ngx_http_process_request(r_00);
        return;
      }
    } while (rv == -2);
    if (6 < *(ulong *)puVar1[10]) {
      ngx_log_error_core(7,(ngx_log_t *)puVar1[10],0,"client sent invalid header line");
    }
    ngx_http_finalize_request(r_00,400);
  }
  else {
    if (6 < *(ulong *)puVar1[10]) {
      ngx_log_error_core(7,(ngx_log_t *)puVar1[10],0x6e,"client timed out");
    }
    *(uint *)(puVar1 + 0x1b) = *(uint *)(puVar1 + 0x1b) & 0xfffff7ff | 0x800;
    ngx_http_close_request(r_00,0x198);
  }
  return;
}

Assistant:

static void
ngx_http_process_request_headers(ngx_event_t *rev)
{
    u_char                     *p;
    size_t                      len;
    ssize_t                     n;
    ngx_int_t                   rc, rv;
    ngx_table_elt_t            *h;
    ngx_connection_t           *c;
    ngx_http_header_t          *hh;
    ngx_http_request_t         *r;
    ngx_http_core_srv_conf_t   *cscf;
    ngx_http_core_main_conf_t  *cmcf;

    c = rev->data;
    r = c->data;

    ngx_log_debug0(NGX_LOG_DEBUG_HTTP, rev->log, 0,
                   "http process request header line");

    if (rev->timedout) {
        ngx_log_error(NGX_LOG_INFO, c->log, NGX_ETIMEDOUT, "client timed out");
        c->timedout = 1;
        ngx_http_close_request(r, NGX_HTTP_REQUEST_TIME_OUT);
        return;
    }

    cmcf = ngx_http_get_module_main_conf(r, ngx_http_core_module);

    rc = NGX_AGAIN;

    for ( ;; ) {

        if (rc == NGX_AGAIN) {

            if (r->header_in->pos == r->header_in->end) {

                rv = ngx_http_alloc_large_header_buffer(r, 0);

                if (rv == NGX_ERROR) {
                    ngx_http_close_request(r, NGX_HTTP_INTERNAL_SERVER_ERROR);
                    return;
                }

                if (rv == NGX_DECLINED) {
                    p = r->header_name_start;

                    r->lingering_close = 1;

                    if (p == NULL) {
                        ngx_log_error(NGX_LOG_INFO, c->log, 0,
                                      "client sent too large request");
                        ngx_http_finalize_request(r,
                                            NGX_HTTP_REQUEST_HEADER_TOO_LARGE);
                        return;
                    }

                    len = r->header_in->end - p;

                    if (len > NGX_MAX_ERROR_STR - 300) {
                        len = NGX_MAX_ERROR_STR - 300;
                    }

                    ngx_log_error(NGX_LOG_INFO, c->log, 0,
                                "client sent too long header line: \"%*s...\"",
                                len, r->header_name_start);

                    ngx_http_finalize_request(r,
                                            NGX_HTTP_REQUEST_HEADER_TOO_LARGE);
                    return;
                }
            }

            n = ngx_http_read_request_header(r);

            if (n == NGX_AGAIN || n == NGX_ERROR) {
                return;
            }
        }

        /* the host header could change the server configuration context */
        cscf = ngx_http_get_module_srv_conf(r, ngx_http_core_module);

        rc = ngx_http_parse_header_line(r, r->header_in,
                                        cscf->underscores_in_headers);

        if (rc == NGX_OK) {

            r->request_length += r->header_in->pos - r->header_name_start;

            if (r->invalid_header && cscf->ignore_invalid_headers) {

                /* there was error while a header line parsing */

                ngx_log_error(NGX_LOG_INFO, c->log, 0,
                              "client sent invalid header line: \"%*s\"",
                              r->header_end - r->header_name_start,
                              r->header_name_start);
                continue;
            }

            /* a header line has been parsed successfully */

            h = ngx_list_push(&r->headers_in.headers);
            if (h == NULL) {
                ngx_http_close_request(r, NGX_HTTP_INTERNAL_SERVER_ERROR);
                return;
            }

            h->hash = r->header_hash;

            h->key.len = r->header_name_end - r->header_name_start;
            h->key.data = r->header_name_start;
            h->key.data[h->key.len] = '\0';

            h->value.len = r->header_end - r->header_start;
            h->value.data = r->header_start;
            h->value.data[h->value.len] = '\0';

            h->lowcase_key = ngx_pnalloc(r->pool, h->key.len);
            if (h->lowcase_key == NULL) {
                ngx_http_close_request(r, NGX_HTTP_INTERNAL_SERVER_ERROR);
                return;
            }

            if (h->key.len == r->lowcase_index) {
                ngx_memcpy(h->lowcase_key, r->lowcase_header, h->key.len);

            } else {
                ngx_strlow(h->lowcase_key, h->key.data, h->key.len);
            }

            hh = ngx_hash_find(&cmcf->headers_in_hash, h->hash,
                               h->lowcase_key, h->key.len);

            if (hh && hh->handler(r, h, hh->offset) != NGX_OK) {
                return;
            }

            ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http header: \"%V: %V\"",
                           &h->key, &h->value);

            continue;
        }

        if (rc == NGX_HTTP_PARSE_HEADER_DONE) {

            /* a whole header has been parsed successfully */

            ngx_log_debug0(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http header done");

            r->request_length += r->header_in->pos - r->header_name_start;

            r->http_state = NGX_HTTP_PROCESS_REQUEST_STATE;

            rc = ngx_http_process_request_header(r);

            if (rc != NGX_OK) {
                return;
            }

            ngx_http_process_request(r);

            return;
        }

        if (rc == NGX_AGAIN) {

            /* a header line parsing is still not complete */

            continue;
        }

        /* rc == NGX_HTTP_PARSE_INVALID_HEADER */

        ngx_log_error(NGX_LOG_INFO, c->log, 0,
                      "client sent invalid header line");

        ngx_http_finalize_request(r, NGX_HTTP_BAD_REQUEST);
        return;
    }
}